

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.cpp
# Opt level: O0

ostream * operator<<(ostream *out,
                    vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *v)

{
  size_type sVar1;
  complex *pcVar2;
  ostream *poVar3;
  int local_1c;
  int i;
  vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *v_local;
  ostream *out_local;
  
  std::operator<<(out,"[");
  local_1c = 0;
  while( true ) {
    sVar1 = std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::size(v);
    if (sVar1 - 1 <= (ulong)(long)local_1c) break;
    pcVar2 = (complex *)
             std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::operator[]
                       (v,(long)local_1c);
    poVar3 = std::operator<<(out,pcVar2);
    std::operator<<(poVar3,", ");
    local_1c = local_1c + 1;
  }
  pcVar2 = (complex *)
           std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::back(v);
  poVar3 = std::operator<<(out,pcVar2);
  std::operator<<(poVar3,"]");
  return out;
}

Assistant:

std::ostream &operator<<(std::ostream &out, const std::vector<T> &v)
{
    out << "[";
    for (auto i = 0; i < v.size() - 1; i++)
    {
        out << v[i] << ", ";
    }
    out << v.back() << "]";

    return out;
}